

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::ToNumberInPlace
              (Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  Var pvVar2;
  double value;
  
  bVar1 = TaggedInt::Is(aRight);
  if ((ulong)aRight >> 0x32 != 0 || bVar1) {
    return aRight;
  }
  value = JavascriptConversion::ToNumber(aRight,scriptContext);
  pvVar2 = JavascriptNumber::ToVarInPlace(value,scriptContext,result);
  return pvVar2;
}

Assistant:

Var JavascriptOperators::ToNumberInPlace(Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_ConvNumberInPlace);
        if (TaggedInt::Is(aRight) || JavascriptNumber::Is_NoTaggedIntCheck(aRight))
        {
            return aRight;
        }

        return JavascriptNumber::ToVarInPlace(JavascriptConversion::ToNumber(aRight, scriptContext), scriptContext, result);
        JIT_HELPER_END(Op_ConvNumberInPlace);
    }